

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

size_t FSE_buildCTable_raw(FSE_CTable *ct,uint nbBits)

{
  uint uVar1;
  uint local_4c;
  U32 deltaNbBits;
  uint s;
  FSE_symbolCompressionTransform *symbolTT;
  void *FSCT;
  U16 *tableU16;
  void *ptr;
  uint maxSymbolValue;
  uint tableMask;
  uint tableSize;
  uint nbBits_local;
  FSE_CTable *ct_local;
  
  uVar1 = 1 << ((byte)nbBits & 0x1f);
  if (nbBits == 0) {
    ct_local = (FSE_CTable *)0xffffffffffffffff;
  }
  else {
    *(short *)ct = (short)nbBits;
    *(short *)((long)ct + 2) = (short)(uVar1 - 1);
    for (local_4c = 0; local_4c < uVar1; local_4c = local_4c + 1) {
      *(short *)((long)ct + (ulong)local_4c * 2 + 4) = (short)uVar1 + (short)local_4c;
    }
    for (local_4c = 0; local_4c <= uVar1 - 1; local_4c = local_4c + 1) {
      ct[(ulong)(uVar1 >> 1) + (ulong)local_4c * 2 + 2] =
           nbBits * 0x10000 - (1 << ((byte)nbBits & 0x1f));
      ct[(ulong)(uVar1 >> 1) + (ulong)local_4c * 2 + 1] = local_4c - 1;
    }
    ct_local = (FSE_CTable *)0x0;
  }
  return (size_t)ct_local;
}

Assistant:

size_t FSE_buildCTable_raw (FSE_CTable* ct, unsigned nbBits)
{
    const unsigned tableSize = 1 << nbBits;
    const unsigned tableMask = tableSize - 1;
    const unsigned maxSymbolValue = tableMask;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableSize>>1);   /* assumption : tableLog >= 1 */
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    unsigned s;

    /* Sanity checks */
    if (nbBits < 1) return ERROR(GENERIC);             /* min size */

    /* header */
    tableU16[-2] = (U16) nbBits;
    tableU16[-1] = (U16) maxSymbolValue;

    /* Build table */
    for (s=0; s<tableSize; s++)
        tableU16[s] = (U16)(tableSize + s);

    /* Build Symbol Transformation Table */
    {   const U32 deltaNbBits = (nbBits << 16) - (1 << nbBits);
        for (s=0; s<=maxSymbolValue; s++) {
            symbolTT[s].deltaNbBits = deltaNbBits;
            symbolTT[s].deltaFindState = s-1;
    }   }

    return 0;
}